

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.cpp
# Opt level: O1

string * __thiscall
duckdb::ParseInfo::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,ParseInfo *this,CatalogType type)

{
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  string local_60;
  string local_40;
  
  iVar2 = (int)this;
  if (iVar2 < 0x1a) {
    switch(iVar2) {
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "TABLE";
      pcVar1 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "SCHEMA";
      pcVar1 = "";
      break;
    case 3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "VIEW";
      pcVar1 = "";
      break;
    case 4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "INDEX";
      pcVar1 = "";
      break;
    default:
switchD_0076e48e_caseD_5:
      this_00 = (InternalException *)
                __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,type));
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "ParseInfo::TypeToString for CatalogType with type: %s not implemented","");
      EnumUtil::ToString<duckdb::CatalogType>(&local_40,(CatalogType)this);
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "SEQUENCE";
      pcVar1 = "";
      break;
    case 8:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "TYPE";
      pcVar1 = "";
    }
  }
  else if (iVar2 < 0x1f) {
    if (iVar2 == 0x1a) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "FUNCTION";
      pcVar1 = "";
    }
    else {
      if (iVar2 != 0x1e) goto switchD_0076e48e_caseD_5;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "MACRO";
      pcVar1 = "";
    }
  }
  else if (iVar2 == 0x1f) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "MACRO TABLE";
    pcVar1 = "";
  }
  else {
    if (iVar2 != 0x47) goto switchD_0076e48e_caseD_5;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "SECRET";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string ParseInfo::TypeToString(CatalogType type) {
	switch (type) {
	case CatalogType::TABLE_ENTRY:
		return "TABLE";
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		return "FUNCTION";
	case CatalogType::INDEX_ENTRY:
		return "INDEX";
	case CatalogType::SCHEMA_ENTRY:
		return "SCHEMA";
	case CatalogType::TYPE_ENTRY:
		return "TYPE";
	case CatalogType::VIEW_ENTRY:
		return "VIEW";
	case CatalogType::SEQUENCE_ENTRY:
		return "SEQUENCE";
	case CatalogType::MACRO_ENTRY:
		return "MACRO";
	case CatalogType::TABLE_MACRO_ENTRY:
		return "MACRO TABLE";
	case CatalogType::SECRET_ENTRY:
		return "SECRET";
	default:
		throw InternalException("ParseInfo::TypeToString for CatalogType with type: %s not implemented",
		                        EnumUtil::ToString(type));
	}
}